

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O2

void capnp::_::expectPrimitiveEq<capnp::Text::Reader>(Reader a,Reader b)

{
  DebugComparison<capnp::Text::Reader_&,_capnp::Text::Reader_&> _kjCondition;
  Reader b_local;
  Reader a_local;
  
  a_local.super_StringPtr.content.size_ = a.super_StringPtr.content.size_;
  a_local.super_StringPtr.content.ptr = a.super_StringPtr.content.ptr;
  b_local.super_StringPtr.content.size_ = b.super_StringPtr.content.size_;
  b_local.super_StringPtr.content.ptr = b.super_StringPtr.content.ptr;
  _kjCondition.result =
       kj::ArrayPtr<const_char>::operator==
                 ((ArrayPtr<const_char> *)&a_local,(ArrayPtr<const_char> *)&b_local);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition.left = &a_local;
    _kjCondition.right = &b_local;
    kj::_::Debug::
    log<char_const(&)[28],kj::_::DebugComparison<capnp::Text::Reader&,capnp::Text::Reader&>&,capnp::Text::Reader&,capnp::Text::Reader&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
               ,0x9c,ERROR,"\"failed: expected \" \"(a) == (b)\", _kjCondition, a, b",
               (char (*) [28])"failed: expected (a) == (b)",&_kjCondition,&a_local,&b_local);
  }
  return;
}

Assistant:

void expectPrimitiveEq(T a, T b) { EXPECT_EQ(a, b); }